

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O1

bool __thiscall
mocker::detail::ReassociationImpl::areSameAddrs
          (ReassociationImpl *this,shared_ptr<mocker::ir::Addr> *lhs,
          shared_ptr<mocker::ir::Addr> *rhs)

{
  _func_int **__n;
  int iVar1;
  bool bVar2;
  shared_ptr<mocker::ir::IntLiteral> rhsLit;
  shared_ptr<mocker::ir::IntLiteral> lhsLit;
  shared_ptr<mocker::ir::Reg> lhsReg;
  shared_ptr<mocker::ir::Reg> rhsReg;
  shared_ptr<mocker::ir::Addr> local_60;
  shared_ptr<mocker::ir::Addr> local_50;
  shared_ptr<mocker::ir::Addr> local_40;
  shared_ptr<mocker::ir::Addr> local_30;
  
  ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
            (&local_40,(Reg *)lhs);
  ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
            (&local_50,(IntLiteral *)lhs);
  if (local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0 &&
      local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("lhsReg || lhsLit",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                  ,0x9a,
                  "bool mocker::detail::ReassociationImpl::areSameAddrs(const std::shared_ptr<ir::Addr> &, const std::shared_ptr<ir::Addr> &)"
                 );
  }
  ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
            (&local_30,(Reg *)rhs);
  ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
            (&local_60,(IntLiteral *)rhs);
  if (local_60.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0 ||
      local_30.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if ((local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (element_type *)0x0) ||
       (local_60.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0)) {
      if ((local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (element_type *)0x0 ||
           local_30.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (element_type *)0x0) ||
         (__n = local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
                _vptr_Addr,
         __n != local_30.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
                _vptr_Addr)) {
        bVar2 = false;
      }
      else if (__n == (_func_int **)0x0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr[1]._vptr_Addr,
                     local_30.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr[1]._vptr_Addr,(size_t)__n);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              _vptr_Addr ==
              local_60.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              _vptr_Addr;
    }
    if (local_60.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_30.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return bVar2;
  }
  __assert_fail("rhsReg || rhsLit",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                ,0x9d,
                "bool mocker::detail::ReassociationImpl::areSameAddrs(const std::shared_ptr<ir::Addr> &, const std::shared_ptr<ir::Addr> &)"
               );
}

Assistant:

bool detail::ReassociationImpl::areSameAddrs(
    const std::shared_ptr<ir::Addr> &lhs,
    const std::shared_ptr<ir::Addr> &rhs) {
  auto lhsReg = ir::dyc<ir::Reg>(lhs);
  auto lhsLit = ir::dyc<ir::IntLiteral>(lhs);
  assert(lhsReg || lhsLit);
  auto rhsReg = ir::dyc<ir::Reg>(rhs);
  auto rhsLit = ir::dyc<ir::IntLiteral>(rhs);
  assert(rhsReg || rhsLit);
  if (lhsLit && rhsLit)
    return lhsLit->getVal() == rhsLit->getVal();
  if (lhsReg && rhsReg)
    return lhsReg->getIdentifier() == rhsReg->getIdentifier();
  return false;
}